

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Clip_x86_fma::forward_inplace(Clip_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  _func_int **pp_Var4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  _func_int *p_Var15;
  undefined1 (*pauVar16) [32];
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  
  iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  pp_Var4 = this->_vptr_Clip_x86_fma;
  uVar12 = 0;
  uVar11 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar11 = uVar12;
  }
  for (; uVar12 != uVar11; uVar12 = uVar12 + 1) {
    pvVar5 = bottom_top_blob->data;
    sVar6 = bottom_top_blob->elemsize;
    sVar7 = bottom_top_blob->cstep;
    pauVar16 = (undefined1 (*) [32])(sVar7 * uVar12 * sVar6 + (long)pvVar5);
    uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var4[-3]);
    auVar19._4_4_ = uVar1;
    auVar19._0_4_ = uVar1;
    auVar19._8_4_ = uVar1;
    auVar19._12_4_ = uVar1;
    auVar19._16_4_ = uVar1;
    auVar19._20_4_ = uVar1;
    auVar19._24_4_ = uVar1;
    auVar19._28_4_ = uVar1;
    uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var4[-3]);
    auVar21._4_4_ = uVar1;
    auVar21._0_4_ = uVar1;
    auVar21._8_4_ = uVar1;
    auVar21._12_4_ = uVar1;
    auVar21._16_4_ = uVar1;
    auVar21._20_4_ = uVar1;
    auVar21._24_4_ = uVar1;
    auVar21._28_4_ = uVar1;
    lVar13 = 0;
    for (iVar17 = 0; iVar17 + 7 < iVar10; iVar17 = iVar17 + 8) {
      auVar9 = vmaxps_avx(auVar19,*pauVar16);
      auVar9 = vminps_avx(auVar9,auVar21);
      *pauVar16 = auVar9;
      pauVar16 = pauVar16 + 1;
      lVar13 = lVar13 + 8;
    }
    uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var4[-3]);
    auVar18._4_4_ = uVar1;
    auVar18._0_4_ = uVar1;
    auVar18._8_4_ = uVar1;
    auVar18._12_4_ = uVar1;
    uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var4[-3]);
    auVar20._4_4_ = uVar1;
    auVar20._0_4_ = uVar1;
    auVar20._8_4_ = uVar1;
    auVar20._12_4_ = uVar1;
    for (; iVar17 + 3 < iVar10; iVar17 = iVar17 + 4) {
      auVar8 = vmaxps_avx(auVar18,*(undefined1 (*) [16])*pauVar16);
      auVar8 = vminps_avx(auVar8,auVar20);
      *(undefined1 (*) [16])*pauVar16 = auVar8;
      pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
      lVar13 = lVar13 + 4;
    }
    lVar14 = sVar7 * sVar6 * uVar12;
    for (; (int)lVar13 < iVar10; lVar13 = lVar13 + 1) {
      fVar2 = *(float *)((long)pvVar5 + lVar13 * 4 + lVar14);
      p_Var15 = pp_Var4[-3];
      fVar3 = *(float *)(&this->field_0xd0 + (long)p_Var15);
      if (fVar2 < fVar3) {
        *(float *)((long)pvVar5 + lVar13 * 4 + lVar14) = fVar3;
        p_Var15 = pp_Var4[-3];
        fVar2 = fVar3;
      }
      if (*(float *)(&this->field_0xd4 + (long)p_Var15) < fVar2) {
        *(float *)((long)pvVar5 + lVar13 * 4 + lVar14) =
             *(float *)(&this->field_0xd4 + (long)p_Var15);
      }
    }
  }
  return 0;
}

Assistant:

int Clip_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _min_avx512 = _mm512_set1_ps(min);
        __m512 _max_avx512 = _mm512_set1_ps(max);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_max_ps(_p, _min_avx512);
            _p = _mm512_min_ps(_p, _max_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _min_avx = _mm256_set1_ps(min);
        __m256 _max_avx = _mm256_set1_ps(max);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_max_ps(_p, _min_avx);
            _p = _mm256_min_ps(_p, _max_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _min = _mm_set1_ps(min);
        __m128 _max = _mm_set1_ps(max);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_max_ps(_p, _min);
            _p = _mm_min_ps(_p, _max);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < min)
                *ptr = min;
            if (*ptr > max)
                *ptr = max;
            ptr++;
        }
    }

    return 0;
}